

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmSqrMont2(word *b,word *a,qr_o *r,void *stack)

{
  long lVar1;
  word *in_RCX;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *prod;
  zm_mont_params_st *params;
  size_t k;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  zzSqr((word *)k,&params->m0,(size_t)prod,in_RDI);
  zzRedMont((word *)k,&params->m0,(size_t)prod,(word)in_RDI,in_RSI);
  wwCopy(in_RDI,in_RCX,*(size_t *)(in_RDX + 0x30));
  for (local_28 = *(ulong *)(lVar1 + 8); local_28 < (ulong)(*(long *)(in_RDX + 0x30) << 6);
      local_28 = local_28 + 1) {
    zzDoubleMod(prod,in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void zmSqrMont2(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	const zm_mont_params_st* params;
	word* prod = (word*)stack;
	// pre
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	// настроить указатели
	params = (const zm_mont_params_st*)r->params;
	stack = prod + 2 * r->n;
	// b <- a^2 B^{-n} \mod mod
	zzSqr(prod, a, r->n, stack);
	zzRedMont(prod, r->mod, r->n, *(word*)r->params, stack);
	wwCopy(b, prod, r->n);
	// b <- b * B^n / 2^l \mod mod
	for (k = params->l; k < B_PER_W * r->n; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}